

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int fits_make_longstr_key_util
              (fitsfile *fptr,char *keyname,char *value,char *comm,int position,int *status)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  int *status_00;
  int iVar6;
  char *in_RCX;
  char *in_RDX;
  int *in_RSI;
  int in_R8D;
  int *in_R9;
  int fixedSpaceForComments;
  int allInOne;
  int nblanks;
  int processingComment;
  int spaceForComments;
  int addline;
  int ichar;
  int nocomment;
  int tstatus;
  int contin;
  int maxvalchars;
  int finalnamelen;
  int namelen;
  int nchar;
  int nquote;
  int vlen;
  int remaincom;
  int remainval;
  int next;
  char *cptr;
  char tstring [81];
  char tmpkeyname [75];
  char card [81];
  char comstring [81];
  char valstring [81];
  char *in_stack_fffffffffffffd78;
  bool local_27d;
  int in_stack_fffffffffffffd84;
  int in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffd8c;
  uint uVar7;
  int local_270;
  int local_26c;
  int in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  int in_stack_fffffffffffffda0;
  int iVar8;
  int iVar9;
  int iVar10;
  int local_24c;
  int local_244;
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int iVar11;
  char in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffdf9;
  undefined4 uStack_1a9;
  int *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  char acStack_150 [88];
  char local_f8 [96];
  char local_98 [96];
  int *local_38;
  int local_2c;
  char *local_28;
  char *local_20;
  int *local_18;
  
  local_27d = true;
  bVar2 = false;
  iVar10 = 0;
  iVar9 = 0;
  iVar8 = 0x32;
  if (0 < *in_R9) {
    return *in_R9;
  }
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  sVar5 = strlen(in_RDX);
  iVar11 = (int)sVar5;
  if (local_28 == (char *)0x0) {
    local_21c = 0;
    local_26c = in_stack_fffffffffffffd98;
  }
  else {
    sVar5 = strlen(local_28);
    local_21c = (int)sVar5;
    local_26c = in_stack_fffffffffffffd98;
  }
  uStack_1a9._1_1_ = '\0';
  for (status_00 = local_18; (char)*status_00 == ' '; status_00 = (int *)((long)status_00 + 1)) {
  }
  strncpy((char *)((long)&uStack_1a9 + 1),(char *)status_00,0x4a);
  sVar5 = strlen((char *)((long)&uStack_1a9 + 1));
  local_22c = (int)sVar5;
  if (local_22c != 0) {
    for (status_00 = (int *)((long)&uStack_1a9 + (long)local_22c); (char)*status_00 == ' ';
        status_00 = (int *)((long)status_00 + -1)) {
      *(char *)status_00 = '\0';
    }
    sVar5 = strlen((char *)((long)&uStack_1a9 + 1));
    local_22c = (int)sVar5;
  }
  if ((local_22c < 9) &&
     (iVar4 = fftkey((char *)CONCAT71(in_stack_fffffffffffffdf9,in_stack_fffffffffffffdf8),status_00
                    ), iVar4 < 1)) {
    local_230 = 10;
    local_234 = 0x44;
    goto LAB_00232798;
  }
  if (local_22c == 0) {
LAB_0023273d:
    local_230 = local_22c + 0xb;
    if (0x50 < local_230) {
      ffpmsg((char *)0x23275b);
      ffpmsg((char *)0x232768);
      *local_38 = 0xcf;
      return 0xcf;
    }
  }
  else {
    if (uStack_1a9._1_1_ < 'H') {
      in_stack_fffffffffffffda0 = -1;
    }
    else if (uStack_1a9._1_1_ < 'I') {
      in_stack_fffffffffffffd9c = strncmp((char *)((long)&uStack_1a9 + 1),"HIERARCH ",9);
      in_stack_fffffffffffffda0 = in_stack_fffffffffffffd9c;
    }
    else {
      in_stack_fffffffffffffd9c = 1;
      in_stack_fffffffffffffda0 = in_stack_fffffffffffffd9c;
    }
    if (in_stack_fffffffffffffda0 != 0) {
      if (uStack_1a9._1_1_ < 'h') {
        local_26c = -1;
      }
      else if (uStack_1a9._1_1_ < 'i') {
        local_26c = strncmp((char *)((long)&uStack_1a9 + 1),"hierarch ",9);
      }
      else {
        local_26c = 1;
      }
      if (local_26c != 0) goto LAB_0023273d;
    }
    local_230 = local_22c + 2;
  }
  local_234 = 0x4e - local_230;
LAB_00232798:
  bVar1 = false;
  iVar4 = 0;
  while (bVar3 = false, local_27d) {
    if (bVar2) {
      if (iVar8 + -3 < local_21c) {
        strcpy(local_98,"\'&\'");
        iVar10 = 0x43 - iVar8;
        memset(local_98 + 3,0x20,(long)iVar10);
        local_98[iVar10 + 3] = '\0';
      }
      else {
        strcpy(local_98,"\'\'");
        iVar10 = 0x44 - iVar8;
        memset(local_98 + 2,0x20,(long)iVar10);
        local_98[iVar10 + 2] = '\0';
      }
      if (local_21c < iVar8 + -3) {
        local_270 = local_21c;
      }
      else {
        local_270 = iVar8 + -3;
      }
      strncpy(local_f8,local_28 + iVar4,(long)local_270);
      local_f8[local_270] = '\0';
      iVar4 = local_270 + iVar4;
      local_21c = local_21c - local_270;
    }
    else {
      sVar5 = strlen(local_20 + iVar4);
      local_224 = 0;
      local_244 = 0;
      uVar7 = in_stack_fffffffffffffd8c;
      while( true ) {
        in_stack_fffffffffffffd8c = uVar7 & 0xffffff;
        if (local_244 < (int)sVar5) {
          in_stack_fffffffffffffd8c = CONCAT13(local_244 + local_224 < local_234,(int3)uVar7);
        }
        if ((char)(in_stack_fffffffffffffd8c >> 0x18) == '\0') break;
        if (local_20[iVar4 + local_244] == '\'') {
          local_224 = local_224 + 1;
        }
        local_244 = local_244 + 1;
        uVar7 = in_stack_fffffffffffffd8c;
      }
      if (local_234 - local_224 <= local_244) {
        local_244 = local_234 - local_224;
      }
      in_stack_fffffffffffffdf8 = '\0';
      in_stack_fffffffffffffd88 = local_244;
      strncat(&stack0xfffffffffffffdf8,local_20 + iVar4,(long)local_244);
      if (bVar1) {
        ffs2c_nopad((char *)CONCAT44(iVar10,iVar9),(char *)CONCAT44(iVar8,in_stack_fffffffffffffda0)
                    ,(int *)CONCAT44(in_stack_fffffffffffffd9c,local_26c));
        sVar5 = strlen(local_98);
        local_220 = (int)sVar5;
        iVar6 = local_220 + 10;
      }
      else {
        ffs2c((char *)CONCAT44(iVar10,iVar9),(char *)CONCAT44(iVar8,in_stack_fffffffffffffda0),
              (int *)CONCAT44(in_stack_fffffffffffffd9c,local_26c));
        sVar5 = strlen(local_98);
        local_220 = (int)sVar5;
        iVar6 = local_230 + local_220;
      }
      iVar6 = -iVar6;
      local_24c = iVar6 + 0x50;
      if ((((!bVar1) && (iVar11 == local_244)) && (local_230 + local_220 + local_21c + 3 < 0x51)) &&
         (local_21c < iVar8 + -3)) {
        iVar9 = 1;
      }
      local_228 = local_244;
      if (iVar9 == 0) {
        if ((iVar6 == -0x50) && ((local_21c != 0 || (local_244 < iVar11)))) {
          local_228 = local_244 + -1;
          if (local_98[local_220 + -2] == '\'') {
            local_98[local_220 + -3] = '&';
            local_98[local_220 + -1] = '\0';
          }
          else {
            local_98[local_220 + -2] = '&';
          }
        }
        else if (((iVar6 != -0x50) && (local_244 < iVar11)) ||
                ((local_21c != 0 &&
                 (((local_24c < iVar8 || (iVar6 + 0x4d < local_21c)) || (iVar8 + -3 < local_21c)))))
                ) {
          local_98[local_220 + -1] = '&';
          local_98[local_220] = '\'';
          local_98[local_220 + 1] = '\0';
        }
      }
      if (iVar9 == 0) {
        if (local_228 < iVar11) {
          bVar3 = true;
          iVar11 = iVar11 - local_228;
          iVar4 = local_228 + iVar4;
          local_234 = 0x44;
        }
        else {
          bVar3 = true;
          iVar11 = 0;
          iVar4 = 0;
          bVar2 = true;
          if ((local_21c != 0) && (iVar8 <= local_24c)) {
            bVar3 = false;
            iVar4 = local_21c;
            if (iVar8 + -3 <= local_21c) {
              iVar4 = iVar8 + -3;
            }
            in_stack_fffffffffffffd84 = iVar4;
            strncpy(local_f8,local_28,(long)iVar4);
            local_f8[iVar4] = '\0';
            local_21c = local_21c - iVar4;
          }
        }
      }
      else {
        bVar3 = false;
        if (local_28 == (char *)0x0) {
          local_f8[0] = '\0';
        }
        else {
          strcpy(local_f8,local_28);
        }
        iVar11 = 0;
        local_21c = 0;
      }
    }
    if (bVar1) {
      if (bVar3) {
        ffmkky(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      }
      else {
        ffmkky(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      }
      strncpy(acStack_150,"   ",2);
    }
    else if (bVar3) {
      ffmkky(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
    else {
      ffmkky(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
    if (local_2c < 0) {
      ffprec((fitsfile *)CONCAT71(in_stack_fffffffffffffdf9,in_stack_fffffffffffffdf8),
             (char *)status_00,(int *)CONCAT44(iVar4,iVar11));
    }
    else {
      ffirec((fitsfile *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             in_stack_fffffffffffffd84,in_stack_fffffffffffffd78,(int *)0x232dea);
      local_2c = local_2c + 1;
    }
    bVar1 = true;
    local_27d = 0 < iVar11 || 0 < local_21c;
  }
  return *local_38;
}

Assistant:

int fits_make_longstr_key_util( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *keyname,/* I - name of keyword to write */
            const char *value,  /* I - keyword value            */
            const char *comm,   /* I - keyword comment          */
            int position,       /* I - position to insert (-1 for end) */
            int  *status)       /* IO - error status            */
/*
  Write (put) the keyword, value and comment into the FITS header.
  This routine is a modified version of ffpkys which supports the
  HEASARC long string convention and can write arbitrarily long string
  keyword values.  The value is continued over multiple keywords that
  have the name CONTINUE without an equal sign in column 9 of the card.
  This routine also supports simple string keywords which are less than
  75 characters in length.
*/
{
    char valstring[FLEN_CARD], comstring[FLEN_CARD];
    /* give tmpkeyname same size restriction as in ffmkky */
    char card[FLEN_CARD], tmpkeyname[FLEN_KEYWORD];
    char tstring[FLEN_CARD], *cptr;
    int next, remainval, remaincom, vlen, nquote, nchar; 
    int namelen, finalnamelen, maxvalchars;
    int contin, tstatus=-1, nocomment=0, ichar, addline=1;
    int spaceForComments=0, processingComment=0, nblanks=0, allInOne=0;
    /* This setting is arbitrary */
    int fixedSpaceForComments = 50;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    remainval = strlen(value);   
    if (comm)
       remaincom = strlen(comm);
    else
       remaincom = 0;

    tmpkeyname[0] = '\0';    
    cptr = keyname;
    while(*cptr == ' ')   /* skip over leading spaces in name */
        cptr++;
        
    strncpy(tmpkeyname, cptr, FLEN_KEYWORD-1);
    tmpkeyname[FLEN_KEYWORD-1] = '\0';
    
    namelen = strlen(tmpkeyname);
    if (namelen)         /* skip trailing spaces in name */
    {
       cptr = tmpkeyname + namelen - 1;
       while (*cptr == ' ')
       {
          *cptr = '\0';
          cptr--;
       }
       namelen = strlen(tmpkeyname);
    }
    
    /* First determine final length of keyword.  ffmkky may prepend 
       "HIERARCH " to it, and we need to determine that now using the
       same criteria as ffmkky. */
    
    if (namelen <= 8 && (fftkey(cptr, &tstatus) <= 0) )
    {
       /* This a normal 8-character FITS keyword. ffmkky
          will pad it to 8 if necessary, and add "= ". */
       finalnamelen = 10;
       /* 2 additional chars are needed for opening/closing quotes. */
       maxvalchars = (FLEN_CARD-1) - finalnamelen  - 2;
    }
    else
    { 
       if (namelen && ((FSTRNCMP(tmpkeyname, "HIERARCH ", 9) == 0) ||
                   (FSTRNCMP(tmpkeyname, "hierarch ", 9) == 0)) )
       {
          /* We have an explicitly marked long keyword, so HIERARCH
             will not be prepended.  However it can then have
             " = " or "= ", depending on size of value string. 
             For now, assume "= ". 
             
             If we're here, must have 75 > namelen > 9. */
          finalnamelen = namelen + 2;
       }
       else
       {
          /* ffmkky is going to prepend "HIERARCH " to the keyword,
             and " = " or "= ". */
          finalnamelen = namelen + 11;
          if (finalnamelen > FLEN_CARD-1)
          {
             ffpmsg("The following keyword is too long to fit on a card in ffpkls:");
             ffpmsg(keyname);
             return(*status = BAD_KEYCHAR);
          }
       }
       maxvalchars = (FLEN_CARD-1) - finalnamelen - 2;       
    }
    
    contin = 0;
    next = 0;                  /* pointer to next character to write */

    while (addline)
    {
        if (processingComment)
        {
           if (remaincom > (fixedSpaceForComments-3))
           {
              strcpy(valstring,"'&'");
              nblanks = (FLEN_CARD-1) - fixedSpaceForComments - 13;
              memset(&valstring[3], 32, nblanks);
              valstring[nblanks+3] = '\0';
           }
           else
           {
              strcpy(valstring,"''");
              nblanks = (FLEN_CARD-1) - fixedSpaceForComments - 12;
              memset(&valstring[2], 32, nblanks);
              valstring[nblanks+2] = '\0';
           }
           nchar = minvalue(remaincom, fixedSpaceForComments-3);
           strncpy(comstring, &comm[next], nchar);
           comstring[nchar] = '\0';
           next += nchar;
           remaincom -= nchar;
        }
        else
        {
           vlen = strlen(&value[next]);
           nquote = 0;
           for (ichar=0; ichar<vlen && (ichar+nquote)<maxvalchars; ++ichar)
           {
              if (value[next+ichar] == '\'')
                 ++nquote;
           }
           /* Note that (ichar+nquote) can be 1 greater than maxvalchars
              if last processed char is a quote.  Therefore do this check: */
           nchar = minvalue(ichar,(maxvalchars-nquote));
    
           tstring[0] = '\0';
           strncat(tstring, &value[next], nchar); /* copy string to temp buff */
           /* expand quotes, and put quotes around the string */
           if (contin)
           {
              ffs2c_nopad(tstring,valstring,status);
              vlen = strlen(valstring);
              spaceForComments = (FLEN_CARD-1) - (10 + vlen);
           }
           else
           {
              ffs2c(tstring, valstring, status);
              vlen = strlen(valstring);
              spaceForComments = (FLEN_CARD-1) - (finalnamelen + vlen);
           }
           
           /* Check for simplest case where everything fits on first line.*/
           if (!contin && (remainval==nchar) && 
                      (finalnamelen+vlen+remaincom+3 < FLEN_CARD) &&
                      remaincom < fixedSpaceForComments-3)
              allInOne=1;
           
           if (!allInOne)
           {   
              /* There are 2 situations which require overwriting the last char of
                 valstring with a continue symbol '&' */
              if (!spaceForComments && (remaincom || (remainval > nchar)))

              {
                  nchar -= 1;        /* outputting one less character now */

                  if (valstring[vlen-2] != '\'')
                      valstring[vlen-2] = '&';  /*  overwrite last char with &  */
                  else
                  { /* last char was a pair of single quotes, so over write both */
                      valstring[vlen-3] = '&';
                      valstring[vlen-1] = '\0';
                  }
              }
              else if ( 
               /* Cases where '&' should be appended to valstring rather than
                   overwritten.  This would mostly be due to the inclusion
                   of a comment string requiring additional lines.  But there's
                   also the obscure case where the last character that can
                   fit happened to be a single quote.  Since this was removed
                   with the earlier 'nchar = minvlaue()' test, the valstring
                   must be continued even though it's one space short of filling
                   this line.  We then append it with a '&'. */


              (spaceForComments && nchar < remainval) || 
              (remaincom && (spaceForComments < fixedSpaceForComments ||
                        spaceForComments-3 < remaincom ||
                        remaincom > fixedSpaceForComments-3))) 
              {
                valstring[vlen-1] = '&';
                 valstring[vlen] = '\'';
                 valstring[vlen+1] = '\0';
                 vlen+=1;
              }
           }
           
           if (allInOne)
           {
              nocomment=0;
              /* The allInOne test ensures that comm length will
                 fit within FLEN_CARD buffer size */
              if (comm)
                 strcpy(comstring, comm);
              else
                 comstring[0]='\0';
              /* Ensure that loop exits after this iteration */
              remainval=0;
              remaincom=0;
           }
           else if (remainval > nchar)
           {
              nocomment = 1;
              remainval -= nchar;
              next  += nchar;
              maxvalchars = (FLEN_CARD-1) - 12;
           }
           else
           {
              /* We've reached the end of val input.  Now switch to writing
                 comment (if any).  This block can only be reached once. */
              /* Do not write comments on this line if fewer than
                 fixedSpaceForComments are available for the comment string 
                 and " / ". */
              nocomment = 1;
              remainval = 0;
              next = 0;
              processingComment = 1;
              if (remaincom && spaceForComments >= fixedSpaceForComments)
              {
                 nocomment = 0;
                 nchar = minvalue(remaincom, fixedSpaceForComments-3);
                 strncpy(comstring, comm, nchar);
                 comstring[nchar] = '\0';
                 next = nchar;
                 remaincom -= nchar;
              }
           }

        } /* end if processing valstring and not comment */

        if (contin)           /* This is a CONTINUEd keyword */
        {
           if (nocomment) {
               ffmkky("CONTINUE", valstring, NULL, card, status); /* make keyword w/o comment */
           } else {
               ffmkky("CONTINUE", valstring, comstring, card, status); /* make keyword */
	   }
           strncpy(&card[8], "   ",  2);  /* overwrite the '=' */
        }
        else
        {
           if (nocomment)
              ffmkky(keyname, valstring, NULL, card, status);  /* make keyword */
           else
              ffmkky(keyname, valstring, comstring, card, status);  /* make keyword */
        }

        if (position < 0)
           ffprec(fptr, card, status);  /* write the keyword */
        else
        {
           ffirec(fptr, position, card, status);  /* insert the keyword */
           ++position;
        }
           
        contin = 1;
        nocomment = 0;
        addline = (int)(remainval > 0 || remaincom > 0);
    }
    return(*status);
}